

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agg_line_profile_aa.cpp
# Opt level: O2

value_type * __thiscall agg::line_profile_aa::profile(line_profile_aa *this,double w)

{
  int iVar1;
  uint size;
  
  iVar1 = (int)(long)(w * 256.0 + 0.5);
  *(int *)(this + 0x110) = iVar1;
  size = iVar1 + 0x600;
  if (*(uint *)(this + 8) < size) {
    pod_array<unsigned_char>::resize((pod_array<unsigned_char> *)this,size);
  }
  return *(value_type **)this;
}

Assistant:

line_profile_aa::value_type* line_profile_aa::profile(double w)
    {
        m_subpixel_width = uround(w * subpixel_scale);
        unsigned size = m_subpixel_width + subpixel_scale * 6;
        if(size > m_profile.size())
        {
            m_profile.resize(size);
        }
        return &m_profile[0];
    }